

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

int tile_worker_hook(void *arg1,void *arg2)

{
  ThreadData *td;
  TileDataDec *tile_data;
  byte allow_update_cdf;
  int iVar1;
  uint uVar2;
  TileJobsDec *pTVar3;
  
  td = *arg1;
  iVar1 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xe8));
  if (iVar1 == 0) {
    *(undefined4 *)((long)arg1 + 0xe0) = 1;
    if (*(int *)((long)arg2 + 0x9e44) == 0) {
      allow_update_cdf = *(byte *)((long)arg2 + 0x3d4c) ^ 1;
    }
    else {
      allow_update_cdf = 0;
    }
    set_decode_func_pointers(td,3);
    while ((td->dcb).corrupted == 0) {
      pTVar3 = get_dec_job_info((AV1DecTileMT *)((long)arg2 + 0x58d30));
      if (pTVar3 == (TileJobsDec *)0x0) {
        uVar2 = (uint)((td->dcb).corrupted == 0);
        goto LAB_00168a13;
      }
      tile_data = pTVar3->tile_data;
      tile_worker_hook_init
                ((AV1Decoder *)arg2,(DecWorkerData *)arg1,pTVar3->tile_buffer,tile_data,
                 allow_update_cdf);
      decode_tile((AV1Decoder *)arg2,td,(tile_data->tile_info).tile_row,
                  (tile_data->tile_info).tile_col);
    }
    uVar2 = 0;
LAB_00168a13:
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    *(undefined4 *)(*arg1 + 0x3ad0) = 1;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int tile_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  AV1_COMMON *cm = &pbi->common;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x3);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
      // decode tile
      int tile_row = tile_data->tile_info.tile_row;
      int tile_col = tile_data->tile_info.tile_col;
      decode_tile(pbi, td, tile_row, tile_col);
    } else {
      break;
    }
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}